

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcTendonAnchor::IfcTendonAnchor(IfcTendonAnchor *this)

{
  IfcTendonAnchor *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcReinforcingElement).field_0x1a0,"IfcTendonAnchor")
  ;
  Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
            (&this->super_IfcReinforcingElement,&PTR_construction_vtable_24__010dc550);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTendonAnchor,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTendonAnchor,_0UL> *)
             &(this->super_IfcReinforcingElement).field_0x190,&PTR_construction_vtable_24__010dc730)
  ;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x10dc3d0;
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x1a0 = 0x10dc538;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x10dc3f8;
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x10dc420;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x10dc448;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x10dc470;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x138 = 0x10dc498;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x10dc4c0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    field_0x158 = 0x10dc4e8;
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x190 = 0x10dc510;
  return;
}

Assistant:

IfcTendonAnchor() : Object("IfcTendonAnchor") {}